

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

void * GA_Getmem(int type,int nelem,int grp_id)

{
  int iVar1;
  long *plVar2;
  long lVar3;
  int iVar4;
  Integer IVar5;
  Integer type_00;
  char **ptr_arr;
  long lVar6;
  int iVar7;
  long lVar8;
  Integer status;
  long local_38;
  
  iVar1 = (int)GAnproc * 8 + 0x20;
  IVar5 = pnga_type_f2c((long)type);
  iVar7 = nelem * *(int *)((long)&ga_types[0].size + ((IVar5 << 0x20) + -0x3e800000000 >> 0x1c));
  if (GA_memory_limited == '\x01') {
    GA_total_memory = GA_total_memory - (iVar7 + iVar1);
    status = (ulong)~GA_total_memory >> 0x3f;
    type_00 = pnga_type_f2c(0x3f2);
    pnga_gop(type_00,&status,1,"&&");
    if (status == 0) {
      GA_total_memory = GA_total_memory + (iVar7 + iVar1);
    }
  }
  else {
    status = 1;
  }
  ptr_arr = (char **)malloc(CONCAT44(GAnproc._4_4_,(int)GAnproc) << 3);
  lVar8 = (long)iVar1;
  iVar4 = gai_get_shmem(ptr_arr,iVar7 + lVar8,(int)IVar5,&local_38,grp_id);
  if (iVar4 != 0) {
    pnga_error("ga_getmem: failed to allocate memory",(long)(iVar7 + iVar1));
  }
  plVar2 = (long *)ptr_arr[GAme];
  lVar3 = CONCAT44(GAnproc._4_4_,(int)GAnproc);
  for (lVar6 = 0; lVar6 < lVar3; lVar6 = lVar6 + 1) {
    ptr_arr[lVar6] = ptr_arr[lVar6] + lVar8;
  }
  *plVar2 = local_38 + lVar8;
  plVar2[1] = (IVar5 << 0x20) >> 0x20;
  plVar2[2] = (long)(iVar7 + iVar1);
  memcpy(plVar2 + 4,ptr_arr,CONCAT44(GAnproc._4_4_,(int)GAnproc) << 3);
  free(ptr_arr);
  return (char *)((long)plVar2 + lVar8);
}

Assistant:

void *GA_Getmem(int type, int nelem, int grp_id)
{
char **ptr_arr=(char**)0;
int  rc,i;
long id;
int bytes;
int extra=sizeof(getmem_t)+GAnproc*sizeof(char*);
char *myptr;
Integer status;
     type = pnga_type_f2c(type);	
     bytes = nelem *  GAsizeofM(type);
     if(GA_memory_limited){
         GA_total_memory -= bytes+extra;
         status = (GA_total_memory >= 0) ? 1 : 0;
         /* pnga_gop(pnga_type_f2c(MT_F_INT), &status, 1, "*"); */
         pnga_gop(pnga_type_f2c(MT_F_INT), &status, 1, "&&");
         if(!status)GA_total_memory +=bytes+extra;
     }else status = 1;

     ptr_arr=malloc(GAnproc*sizeof(char**));
     rc= gai_getmem("ga_getmem", ptr_arr,(Integer)bytes+extra, type, &id, grp_id);
     if(rc)pnga_error("ga_getmem: failed to allocate memory",bytes+extra);

     myptr = ptr_arr[GAme];  

     /* make sure that remote memory addresses point to user memory */
     for(i=0; i<GAnproc; i++)ptr_arr[i] += extra;

#ifndef AVOID_MA_STORAGE
     if(ARMCI_Uses_shm()) 
#endif
        id += extra; /* id is used to store offset */

     /* stuff the type and id info at the beginning */
     ((getmem_t*)myptr)->id = id;
     ((getmem_t*)myptr)->type = type;
     ((getmem_t*)myptr)->size = bytes+extra;

     /* add ptr info */
     memcpy(myptr+sizeof(getmem_t),ptr_arr,(size_t)GAnproc*sizeof(char**));
     free(ptr_arr);

     return (void*)(myptr+extra);
}